

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

Circle * __thiscall
svg::LineChart::polylineToString_abi_cxx11_(LineChart *this,Polyline *polyline,Layout *layout)

{
  Point *center;
  Point *pPVar1;
  Fill *fill;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Circle *in_RDI;
  Layout *in_stack_00000050;
  Polyline *in_stack_00000058;
  uint i;
  vector<svg::Circle,_std::allocator<svg::Circle>_> vertices;
  Polyline shifted_polyline;
  value_type *in_stack_fffffffffffffda8;
  Polyline *in_stack_fffffffffffffdb0;
  Polyline *in_stack_fffffffffffffdb8;
  Polyline *in_stack_fffffffffffffdc0;
  Point *in_stack_fffffffffffffdc8;
  Circle *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  vector<svg::Circle,_std::allocator<svg::Circle>_> *in_stack_fffffffffffffdf8;
  Layout *in_stack_fffffffffffffe00;
  vector<svg::Circle,_std::allocator<svg::Circle>_> *in_stack_fffffffffffffe08;
  string local_1e0 [256];
  LineChart *in_stack_ffffffffffffff20;
  uint local_cc;
  Point local_a0 [6];
  vector<svg::Point,_std::allocator<svg::Point>_> local_38 [2];
  
  this_00 = in_RDI;
  Polyline::Polyline(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Point::Point(local_a0,*(double *)(in_RSI + 0x88),*(double *)(in_RSI + 0x90));
  Polyline::offset((Polyline *)this_00,in_stack_fffffffffffffdc8);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::vector
            ((vector<svg::Circle,_std::allocator<svg::Circle>_> *)0x10f50e);
  local_cc = 0;
  while( true ) {
    center = (Point *)(ulong)local_cc;
    pPVar1 = (Point *)std::vector<svg::Point,_std::allocator<svg::Point>_>::size(local_38);
    if (pPVar1 <= center) break;
    in_stack_fffffffffffffdc0 =
         (Polyline *)
         std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[](local_38,(ulong)local_cc);
    getDimensions(in_stack_ffffffffffffff20);
    fill = (Fill *)optional<svg::Dimensions>::operator->
                             ((optional<svg::Dimensions> *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdb0 =
         (Polyline *)((double)(fill->color).super_Serializeable._vptr_Serializeable / 30.0);
    Fill::Fill((Fill *)in_stack_fffffffffffffdc0,(Defaults)((ulong)fill >> 0x20));
    Color::Color((Color *)this_00,(Defaults)((ulong)center >> 0x20));
    Stroke::Stroke((Stroke *)this_00,(double)center,(Color *)in_stack_fffffffffffffdc0,
                   SUB81((ulong)fill >> 0x38,0));
    Circle::Circle(this_00,center,(double)in_stack_fffffffffffffdc0,fill,
                   (Stroke *)in_stack_fffffffffffffdb0);
    std::vector<svg::Circle,_std::allocator<svg::Circle>_>::push_back
              ((vector<svg::Circle,_std::allocator<svg::Circle>_> *)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8);
    Circle::~Circle((Circle *)0x10f63d);
    Stroke::~Stroke((Stroke *)in_stack_fffffffffffffdb0);
    Color::~Color((Color *)0x10f657);
    Fill::~Fill((Fill *)in_stack_fffffffffffffdb0);
    local_cc = local_cc + 1;
  }
  Polyline::toString_abi_cxx11_(in_stack_00000058,in_stack_00000050);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::vector
            ((vector<svg::Circle,_std::allocator<svg::Circle>_> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  vectorToString<svg::Circle>(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffde8,in_RSI);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector
            ((vector<svg::Circle,_std::allocator<svg::Circle>_> *)in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_1e0);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector
            ((vector<svg::Circle,_std::allocator<svg::Circle>_> *)in_stack_fffffffffffffdc0);
  Polyline::~Polyline(in_stack_fffffffffffffdb0);
  return in_RDI;
}

Assistant:

std::string polylineToString(Polyline const & polyline, Layout const & layout) const
        {
            Polyline shifted_polyline = polyline;
            shifted_polyline.offset(Point(margin.width, margin.height));

            std::vector<Circle> vertices;
            for (unsigned i = 0; i < shifted_polyline.points.size(); ++i)
                vertices.push_back(Circle(shifted_polyline.points[i], getDimensions()->height / 30.0, Color::Black));

            return shifted_polyline.toString(layout) + vectorToString(vertices, layout);
        }